

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error appendAttributeValue
                    (XML_Parser parser,ENCODING *enc,int isCdata,char *ptr,char *end,
                    STRING_POOL *pool)

{
  XML_Char XVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  XML_Error XVar5;
  XML_Char *pXVar6;
  NAMED *pNVar7;
  XML_Char *textEnd;
  XML_Error result;
  XML_Char ch;
  ENTITY *entity;
  XML_Char *name;
  int n;
  int i;
  XML_Char buf [4];
  int tok;
  char *next;
  STRING_POOL *pool_local;
  char *end_local;
  char *ptr_local;
  int isCdata_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  end_local = ptr;
  do {
    i = (*enc->literalScanners[0])(enc,end_local,end,(char **)buf);
    switch(i) {
    case 0:
      if (enc == *(ENCODING **)((long)parser + 0x118)) {
        *(char **)((long)parser + 0x218) = _buf;
      }
      return XML_ERROR_INVALID_TOKEN;
    case 6:
      pXVar6 = poolAppend(pool,enc,end_local,_buf);
      if (pXVar6 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 9:
      iVar4 = (*enc->predefinedEntityName)
                        (enc,end_local + enc->minBytesPerChar,_buf + -(long)enc->minBytesPerChar);
      if ((char)iVar4 == '\0') {
        pXVar6 = poolStoreString((STRING_POOL *)((long)parser + 0x448),enc,
                                 end_local + enc->minBytesPerChar,_buf + -(long)enc->minBytesPerChar
                                );
        if (pXVar6 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pNVar7 = lookup((HASH_TABLE *)((long)parser + 0x290),pXVar6,0);
        *(undefined8 *)((long)parser + 0x460) = *(undefined8 *)((long)parser + 0x468);
        if (pNVar7 == (NAMED *)0x0) {
          if (*(int *)((long)parser + 0x360) != 0) {
            if (enc == *(ENCODING **)((long)parser + 0x118)) {
              *(char **)((long)parser + 0x218) = end_local;
            }
            return XML_ERROR_UNDEFINED_ENTITY;
          }
        }
        else {
          if (*(char *)&pNVar7[7].name != '\0') {
            if (enc == *(ENCODING **)((long)parser + 0x118)) {
              *(char **)((long)parser + 0x218) = end_local;
            }
            return XML_ERROR_RECURSIVE_ENTITY_REF;
          }
          if (pNVar7[6].name != (KEY)0x0) {
            if (enc == *(ENCODING **)((long)parser + 0x118)) {
              *(char **)((long)parser + 0x218) = end_local;
            }
            return XML_ERROR_BINARY_ENTITY_REF;
          }
          if (pNVar7[1].name == (KEY)0x0) {
            if (enc == *(ENCODING **)((long)parser + 0x118)) {
              *(char **)((long)parser + 0x218) = end_local;
            }
            return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
          }
          *(undefined1 *)&pNVar7[7].name = 1;
          XVar5 = appendAttributeValue
                            (parser,*(ENCODING **)((long)parser + 0x1b8),isCdata,pNVar7[1].name,
                             pNVar7[1].name + *(int *)&pNVar7[2].name,pool);
          *(undefined1 *)&pNVar7[7].name = 0;
          if (XVar5 != XML_ERROR_NONE) {
            return XVar5;
          }
        }
      }
      else {
        if ((pool->ptr == pool->end) && (iVar3 = poolGrow(pool), iVar3 == 0)) {
          return XML_ERROR_NO_MEMORY;
        }
        pcVar2 = pool->ptr;
        pool->ptr = pcVar2 + 1;
        *pcVar2 = (char)iVar4;
      }
      break;
    case 10:
      iVar4 = (*enc->charRefNumber)(enc,end_local);
      if (iVar4 < 0) {
        if (enc == *(ENCODING **)((long)parser + 0x118)) {
          *(char **)((long)parser + 0x218) = end_local;
        }
        return XML_ERROR_BAD_CHAR_REF;
      }
      if (((isCdata != 0) || (iVar4 != 0x20)) ||
         ((pool->ptr != pool->start && (pool->ptr[-1] != ' ')))) {
        iVar4 = cm_expat_XmlUtf8Encode(iVar4,(char *)&n);
        if (iVar4 == 0) {
          if (enc == *(ENCODING **)((long)parser + 0x118)) {
            *(char **)((long)parser + 0x218) = end_local;
          }
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (name._4_4_ = 0; name._4_4_ < iVar4; name._4_4_ = name._4_4_ + 1) {
          if ((pool->ptr == pool->end) && (iVar3 = poolGrow(pool), iVar3 == 0)) {
            return XML_ERROR_NO_MEMORY;
          }
          XVar1 = *(XML_Char *)((long)&n + (long)name._4_4_);
          pXVar6 = pool->ptr;
          pool->ptr = pXVar6 + 1;
          *pXVar6 = XVar1;
        }
      }
      break;
    case -4:
      return XML_ERROR_NONE;
    case -3:
      _buf = end_local + enc->minBytesPerChar;
    case 7:
    case 0x27:
      if ((isCdata != 0) || ((pool->ptr != pool->start && (pool->ptr[-1] != ' ')))) {
        if ((pool->ptr == pool->end) && (iVar4 = poolGrow(pool), iVar4 == 0)) {
          return XML_ERROR_NO_MEMORY;
        }
        pXVar6 = pool->ptr;
        pool->ptr = pXVar6 + 1;
        *pXVar6 = ' ';
      }
      break;
    default:
      if (enc == *(ENCODING **)((long)parser + 0x118)) {
        *(char **)((long)parser + 0x218) = end_local;
      }
      return XML_ERROR_UNEXPECTED_STATE;
    case -1:
      if (enc == *(ENCODING **)((long)parser + 0x118)) {
        *(char **)((long)parser + 0x218) = end_local;
      }
      return XML_ERROR_INVALID_TOKEN;
    }
    end_local = _buf;
  } while( true );
}

Assistant:

static enum XML_Error
appendAttributeValue(XML_Parser parser, const ENCODING *enc, int isCdata,
                     const char *ptr, const char *end,
                     STRING_POOL *pool)
{
  for (;;) {
    const char *next;
    int tok = XmlAttributeValueTok(enc, ptr, end, &next);
    switch (tok) {
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_INVALID:
      if (enc == encoding)
        eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, ptr);
        if (n < 0) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        if (!isCdata
            && n == 0x20 /* space */
            && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
          break;
        n = XmlEncode(n, (ICHAR *)buf);
        if (!n) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (i = 0; i < n; i++) {
          if (!poolAppendChar(pool, buf[i]))
            return XML_ERROR_NO_MEMORY;
        }
      }
      break;
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, ptr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = ptr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_ATTRIBUTE_VALUE_S:
    case XML_TOK_DATA_NEWLINE:
      if (!isCdata && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      if (!poolAppendChar(pool, 0x20))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = XmlPredefinedEntityName(enc,
                                              ptr + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (!poolAppendChar(pool, ch))
            return XML_ERROR_NO_MEMORY;
          break;
        }
        name = poolStoreString(&temp2Pool, enc,
                               ptr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.generalEntities, name, 0);
        poolDiscard(&temp2Pool);
        if (!entity) {
          if (dtd.complete) {
            if (enc == encoding)
              eventPtr = ptr;
            return XML_ERROR_UNDEFINED_ENTITY;
          }
        }
        else if (entity->open) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        else if (entity->notation) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        else if (!entity->textPtr) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        }
        else {
          enum XML_Error result;
          const XML_Char *textEnd = entity->textPtr + entity->textLen;
          entity->open = 1;
          result = appendAttributeValue(parser, internalEncoding, isCdata, (char *)entity->textPtr, (char *)textEnd, pool);
          entity->open = 0;
          if (result)
            return result;
        }
      }
      break;
    default:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    ptr = next;
  }
  /* not reached */
}